

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O1

int __thiscall smf::Binasc::processBinaryWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  byte bVar1;
  long lVar2;
  ostream *poVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  char local_2a;
  byte local_29;
  
  uVar9 = (uint)word->_M_string_length;
  if ((int)uVar9 < 1) {
    uVar10 = 0xffffffff;
  }
  else {
    uVar10 = 0xffffffff;
    uVar11 = 0;
    do {
      bVar1 = (word->_M_dataplus)._M_p[uVar11];
      if (1 < bVar1 - 0x30) {
        if (bVar1 != 0x2c) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," at token: ",0xb);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Invalid character in binary number (character is ",0x31)
          ;
          local_2a = (word->_M_dataplus)._M_p[uVar11];
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,&local_2a,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
          cVar7 = (char)poVar3;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar7);
          goto LAB_00115f8c;
        }
        if (uVar10 != 0xffffffff) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," at token: ",0xb);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          pcVar6 = "extra comma in binary number";
          lVar5 = 0x1c;
          goto LAB_00115f6a;
        }
        uVar10 = (uint)uVar11;
      }
      uVar11 = uVar11 + 1;
    } while ((uVar9 & 0x7fffffff) != uVar11);
  }
  if (uVar10 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," at token: ",0xb);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(word->_M_dataplus)._M_p,word->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pcVar6 = "cannot start binary number with a comma";
    lVar5 = 0x27;
    goto LAB_00115f6a;
  }
  if (uVar10 == uVar9 - 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," at token: ",0xb);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(word->_M_dataplus)._M_p,word->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pcVar6 = "cannot end binary number with a comma";
    lVar5 = 0x25;
    goto LAB_00115f6a;
  }
  if (uVar10 == 0xffffffff) {
    uVar8 = 0xffffffff;
    iVar4 = -1;
    if ((int)uVar9 < 9) goto LAB_00115e51;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," at token: ",0xb);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(word->_M_dataplus)._M_p,word->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pcVar6 = "too many digits in binary number";
  }
  else {
    iVar4 = ~uVar10 + uVar9;
    uVar8 = uVar10;
LAB_00115e51:
    if ((int)uVar8 < 5) {
      if (iVar4 < 5) {
        if (uVar10 == 0xffffffff) {
          if ((int)uVar9 < 1) {
            local_29 = 0;
          }
          else {
            uVar11 = 0;
            local_29 = 0;
            do {
              local_29 = local_29 * '\x02' | (word->_M_dataplus)._M_p[uVar11] - 0x30U;
              uVar11 = uVar11 + 1;
            } while ((uVar9 & 0x7fffffff) != uVar11);
          }
        }
        else {
          if ((int)uVar8 < 1) {
            uVar9 = 0;
          }
          else {
            uVar11 = 0;
            uVar9 = 0;
            do {
              uVar9 = (uint)(byte)((word->_M_dataplus)._M_p[uVar11] - 0x30U | (char)uVar9 * '\x02');
              uVar11 = uVar11 + 1;
            } while (uVar8 != uVar11);
          }
          uVar9 = uVar9 << (4U - (char)iVar4 & 0x1f);
          local_29 = (byte)uVar9;
          if (0 < iVar4) {
            lVar5 = (long)(int)uVar10;
            do {
              lVar2 = lVar5 + 1;
              lVar5 = lVar5 + 1;
              uVar9 = uVar9 * 2 & 0xff | (byte)(word->_M_dataplus)._M_p[lVar2] - 0x30;
              local_29 = (byte)uVar9;
            } while (lVar5 < (int)(iVar4 + uVar10));
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_29,1);
        return 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe)
      ;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," at token: ",0xb);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(word->_M_dataplus)._M_p,word->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      pcVar6 = "too many digits to right of comma";
      lVar5 = 0x21;
      goto LAB_00115f6a;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," at token: ",0xb);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(word->_M_dataplus)._M_p,word->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pcVar6 = "too many digits to left of comma";
  }
  lVar5 = 0x20;
LAB_00115f6a:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
  cVar7 = '\0';
LAB_00115f8c:
  std::ostream::put(cVar7);
  std::ostream::flush();
  return 0;
}

Assistant:

int Binasc::processBinaryWord(std::ostream& out, const std::string& word,
		int lineNum) {
	int length = (int)word.size();        // length of ascii binary number
	int commaIndex = -1;             // index location of comma in number
	int leftDigits = -1;             // number of digits to left of comma
	int rightDigits = -1;            // number of digits to right of comma
	int i = 0;

	// make sure that all characters are valid
	for (i=0; i<length; i++) {
		if (word [i] == ',') {
			if (commaIndex != -1) {
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "extra comma in binary number" << std::endl;
				return 0;
			} else {
				commaIndex = i;
			}
		} else if (!(word[i] == '1' || word[i] == '0')) {
			std::cerr << "Error on line " << lineNum << " at token: " << word
				  << std::endl;
			std::cerr << "Invalid character in binary number"
					  " (character is " << word[i] <<")" << std::endl;
			return 0;
		}
	}

	// comma cannot start or end number
	if (commaIndex == 0) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "cannot start binary number with a comma" << std::endl;
		return 0;
	} else if (commaIndex == length - 1 ) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "cannot end binary number with a comma" << std::endl;
		return 0;
	}

	// figure out how many digits there are in binary number
	// number must be able to fit into one byte.
	if (commaIndex != -1) {
		leftDigits = commaIndex;
		rightDigits = length - commaIndex - 1;
	} else if (length > 8) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "too many digits in binary number" << std::endl;
		return 0;
	}
	// if there is a comma, then there cannot be more than 4 digits on a side
	if (leftDigits > 4) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "too many digits to left of comma" << std::endl;
		return 0;
	}
	if (rightDigits > 4) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "too many digits to right of comma" << std::endl;
		return 0;
	}

	// OK, we have a valid binary number, so calculate the byte

	uchar output = 0;

	// if no comma in binary number
	if (commaIndex == -1) {
		for (i=0; i<length; i++) {
			output = output << 1;
			output |= word[i] - '0';
		}
	}
	// if comma in binary number
	else {
		for (i=0; i<leftDigits; i++) {
			output = output << 1;
			output |= word[i] - '0';
		}
		output = output << (4-rightDigits);
		for (i=0+commaIndex+1; i<rightDigits+commaIndex+1; i++) {
			output = output << 1;
			output |= word[i] - '0';
		}
	}

	// send the byte to the output
	out << output;
	return 1;
}